

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderLp.cpp
# Opt level: O0

HighsStatus __thiscall
FilereaderLp::writeModelToFile
          (FilereaderLp *this,HighsOptions *options,string *filename,HighsModel *model)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  char *__filename;
  const_reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  HighsModel *in_RCX;
  FilereaderLp *in_RDI;
  HighsInt iCol_5;
  HighsInt iCol_4;
  HighsInt iCol_3;
  bool default_bounds;
  HighsInt iCol_2;
  bool boxed;
  HighsInt iRow_1;
  double coef;
  double coef_2;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt iCol_1;
  double coef_1;
  HighsInt iCol;
  FILE *file;
  bool has_row_names;
  bool has_col_names;
  HighsSparseMatrix ar_matrix;
  HighsLp *lp;
  FILE *in_stack_fffffffffffffab8;
  FILE *in_stack_fffffffffffffac0;
  FILE *in_stack_fffffffffffffac8;
  FILE *in_stack_fffffffffffffad0;
  FILE *in_stack_fffffffffffffad8;
  FILE *in_stack_fffffffffffffae0;
  HighsSparseMatrix *in_stack_fffffffffffffae8;
  HighsSparseMatrix *in_stack_fffffffffffffaf0;
  undefined7 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0f;
  FILE *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb20;
  int in_stack_fffffffffffffb24;
  FILE *in_stack_fffffffffffffb28;
  FILE *in_stack_fffffffffffffb30;
  HighsInt iRow_00;
  FILE *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb44;
  HighsSparseMatrix *in_stack_fffffffffffffb90;
  char *local_458;
  string local_428 [36];
  int local_404;
  string local_400 [36];
  int local_3dc;
  string local_3d8 [36];
  int local_3b4;
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [35];
  undefined1 local_34d;
  int local_34c;
  string local_2c0 [160];
  string local_168 [36];
  int local_144;
  double local_140;
  string local_138 [32];
  string local_118 [32];
  double local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  string local_e0 [32];
  double local_c0;
  int local_b4;
  FILE *local_b0;
  byte local_a6;
  byte local_a5;
  HighsModel *local_28;
  HighsModel *local_20;
  
  local_28 = in_RCX;
  local_20 = in_RCX;
  HighsSparseMatrix::HighsSparseMatrix(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  HighsSparseMatrix::ensureRowwise(in_stack_fffffffffffffb90);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(local_28->lp_).col_names_);
  local_a5 = sVar4 == (long)(local_28->lp_).num_col_;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(local_28->lp_).row_names_);
  local_a6 = sVar4 == (long)(local_28->lp_).num_row_;
  __filename = (char *)std::__cxx11::string::c_str();
  local_b0 = fopen(__filename,"w");
  writeToFile(in_RDI,(FILE *)local_b0,"\\ %s","File written by HiGHS .lp file handler");
  writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8);
  if ((local_28->lp_).sense_ == kMinimize) {
    local_458 = "min";
  }
  else {
    local_458 = "max";
  }
  writeToFile(in_RDI,(FILE *)local_b0,"%s",local_458);
  writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8);
  writeToFile(in_RDI,(FILE *)local_b0," obj:");
  for (local_b4 = 0; local_b4 < (local_28->lp_).num_col_; local_b4 = local_b4 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(local_28->lp_).col_cost_,(long)local_b4);
    local_c0 = *pvVar5;
    if ((local_c0 != 0.0) || (NAN(local_c0))) {
      writeToFileValue((FilereaderLp *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                       (double)in_stack_fffffffffffffac0,
                       SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
      if ((local_a5 & 1) == 0) {
        writeToFileVar((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8,0
                      );
      }
      else {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(local_28->lp_).col_names_,(long)local_b4);
        std::__cxx11::string::string(local_e0,(string *)pvVar6);
        writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,(FILE *)in_stack_fffffffffffffad8,
                       (string *)in_stack_fffffffffffffad0);
        std::__cxx11::string::~string(local_e0);
      }
    }
  }
  writeToFile(in_RDI,(FILE *)local_b0," ");
  bVar3 = HighsModel::isQp(local_20);
  if (bVar3) {
    writeToFile(in_RDI,(FILE *)local_b0,"+ [");
    for (local_e4 = 0; local_e4 < (local_28->lp_).num_col_; local_e4 = local_e4 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(local_20->hessian_).start_,(long)local_e4);
      for (local_e8 = *pvVar7; iVar2 = local_e8,
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_20->hessian_).start_,(long)(local_e4 + 1)), iVar2 < *pvVar7;
          local_e8 = local_e8 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(local_20->hessian_).index_,(long)local_e8);
        local_ec = *pvVar7;
        if (local_e4 <= local_ec) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(local_20->hessian_).value_,(long)local_e8);
          local_f8 = *pvVar5;
          if (local_e4 != local_ec) {
            local_f8 = local_f8 * 2.0;
          }
          if ((local_f8 != 0.0) || (NAN(local_f8))) {
            writeToFileValue((FilereaderLp *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                             (double)in_stack_fffffffffffffac0,
                             SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
            if ((local_a5 & 1) == 0) {
              writeToFileVar((FilereaderLp *)in_stack_fffffffffffffac0,
                             (FILE *)in_stack_fffffffffffffab8,0);
              writeToFile(in_RDI,(FILE *)local_b0," *");
              writeToFileVar((FilereaderLp *)in_stack_fffffffffffffac0,
                             (FILE *)in_stack_fffffffffffffab8,0);
            }
            else {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&(local_28->lp_).col_names_,(long)local_e4);
              std::__cxx11::string::string(local_118,(string *)pvVar6);
              writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,
                             (FILE *)in_stack_fffffffffffffad8,(string *)in_stack_fffffffffffffad0);
              std::__cxx11::string::~string(local_118);
              writeToFile(in_RDI,(FILE *)local_b0," *");
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&(local_28->lp_).col_names_,(long)local_ec);
              std::__cxx11::string::string(local_138,(string *)pvVar6);
              writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,
                             (FILE *)in_stack_fffffffffffffad8,(string *)in_stack_fffffffffffffad0);
              std::__cxx11::string::~string(local_138);
            }
          }
        }
      }
    }
    writeToFile(in_RDI,(FILE *)local_b0,"  ]/2 ");
  }
  local_140 = (local_28->lp_).offset_;
  if ((local_140 != 0.0) || (NAN(local_140))) {
    writeToFileValue((FilereaderLp *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                     (double)in_stack_fffffffffffffac0,
                     SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
  }
  writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8);
  writeToFile(in_RDI,(FILE *)local_b0,"st");
  writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8);
  for (local_144 = 0; local_144 < (local_28->lp_).num_row_; local_144 = local_144 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(local_28->lp_).row_lower_,(long)local_144);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(local_28->lp_).row_upper_,(long)local_144);
    if ((dVar1 != *pvVar5) || (NAN(dVar1) || NAN(*pvVar5))) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(local_28->lp_).row_lower_,(long)local_144);
      bVar3 = false;
      if (-INFINITY < *pvVar5) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(local_28->lp_).row_upper_,(long)local_144);
        bVar3 = *pvVar5 <= INFINITY && *pvVar5 != INFINITY;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(local_28->lp_).row_lower_,(long)local_144);
      iRow_00 = (HighsInt)((ulong)in_stack_fffffffffffffb30 >> 0x20);
      if (-INFINITY < *pvVar5) {
        if ((local_a6 & 1) == 0) {
          writeToFileCon((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8
                         ,0);
        }
        else {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&(local_28->lp_).row_names_,(long)local_144);
          std::__cxx11::string::string((string *)&stack0xfffffffffffffde8,(string *)pvVar6);
          writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,(FILE *)in_stack_fffffffffffffad8
                         ,(string *)in_stack_fffffffffffffad0);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
        }
        if (bVar3) {
          writeToFile(in_RDI,(FILE *)local_b0,"lo:");
        }
        else {
          writeToFile(in_RDI,(FILE *)local_b0,":");
        }
        in_stack_fffffffffffffb38 = local_b0;
        in_stack_fffffffffffffb44 = local_144;
        HighsSparseMatrix::HighsSparseMatrix(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffb10,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08));
        writeToFileMatrixRow
                  ((FilereaderLp *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   (FILE *)in_stack_fffffffffffffb38,iRow_00,
                   (HighsSparseMatrix *)in_stack_fffffffffffffb28,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffad0);
        HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffac0);
        writeToFile(in_RDI,(FILE *)local_b0," >=");
        in_stack_fffffffffffffb30 = local_b0;
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&(local_28->lp_).row_lower_,(long)local_144);
        writeToFileValue((FilereaderLp *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                         (double)in_stack_fffffffffffffac0,
                         SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
        writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,
                           (FILE *)in_stack_fffffffffffffab8);
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(local_28->lp_).row_upper_,(long)local_144);
      if (*pvVar5 <= INFINITY && *pvVar5 != INFINITY) {
        if ((local_a6 & 1) == 0) {
          writeToFileCon((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8
                         ,0);
        }
        else {
          in_stack_fffffffffffffb28 = local_b0;
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&(local_28->lp_).row_names_,(long)local_144);
          std::__cxx11::string::string(local_2c0,(string *)pvVar6);
          writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,(FILE *)in_stack_fffffffffffffad8
                         ,(string *)in_stack_fffffffffffffad0);
          std::__cxx11::string::~string(local_2c0);
        }
        if (bVar3) {
          writeToFile(in_RDI,(FILE *)local_b0,"up:");
        }
        else {
          writeToFile(in_RDI,(FILE *)local_b0,":");
        }
        in_stack_fffffffffffffb24 = local_144;
        HighsSparseMatrix::HighsSparseMatrix(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffb10,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08));
        writeToFileMatrixRow
                  ((FilereaderLp *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   (FILE *)in_stack_fffffffffffffb38,
                   (HighsInt)((ulong)in_stack_fffffffffffffb30 >> 0x20),
                   (HighsSparseMatrix *)in_stack_fffffffffffffb28,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffad0);
        HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffac0);
        writeToFile(in_RDI,(FILE *)local_b0," <=");
        in_stack_fffffffffffffb10 = local_b0;
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&(local_28->lp_).row_upper_,(long)local_144);
        writeToFileValue((FilereaderLp *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                         (double)in_stack_fffffffffffffac0,
                         SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
        writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,
                           (FILE *)in_stack_fffffffffffffab8);
      }
    }
    else {
      if ((local_a6 & 1) == 0) {
        writeToFileCon((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8,0
                      );
      }
      else {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(local_28->lp_).row_names_,(long)local_144);
        std::__cxx11::string::string(local_168,(string *)pvVar6);
        writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,(FILE *)in_stack_fffffffffffffad8,
                       (string *)in_stack_fffffffffffffad0);
        std::__cxx11::string::~string(local_168);
      }
      writeToFile(in_RDI,(FILE *)local_b0,":");
      HighsSparseMatrix::HighsSparseMatrix(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb10,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08));
      writeToFileMatrixRow
                ((FilereaderLp *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (FILE *)in_stack_fffffffffffffb38,
                 (HighsInt)((ulong)in_stack_fffffffffffffb30 >> 0x20),
                 (HighsSparseMatrix *)in_stack_fffffffffffffb28,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffad0);
      HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffac0);
      writeToFile(in_RDI,(FILE *)local_b0," =");
      std::vector<double,_std::allocator<double>_>::operator[]
                (&(local_28->lp_).row_lower_,(long)local_144);
      writeToFileValue((FilereaderLp *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                       (double)in_stack_fffffffffffffac0,
                       SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
      writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8
                        );
    }
  }
  writeToFile(in_RDI,(FILE *)local_b0,"bounds");
  writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8);
  for (local_34c = 0; local_34c < (local_28->lp_).num_col_; local_34c = local_34c + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(local_28->lp_).col_lower_,(long)local_34c);
    bVar3 = false;
    if ((*pvVar5 == 0.0) && (!NAN(*pvVar5))) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(local_28->lp_).col_upper_,(long)local_34c);
      bVar3 = *pvVar5 == INFINITY;
    }
    local_34d = bVar3;
    if (bVar3 == false) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(local_28->lp_).col_lower_,(long)local_34c);
      if ((-INFINITY < *pvVar5) ||
         (pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(local_28->lp_).col_upper_,(long)local_34c), *pvVar5 < INFINITY)) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(local_28->lp_).col_lower_,(long)local_34c);
        dVar1 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(local_28->lp_).col_upper_,(long)local_34c);
        if ((dVar1 != *pvVar5) || (NAN(dVar1) || NAN(*pvVar5))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(local_28->lp_).col_lower_,(long)local_34c);
          if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) {
            in_stack_fffffffffffffae0 = local_b0;
            std::vector<double,_std::allocator<double>_>::operator[]
                      (&(local_28->lp_).col_lower_,(long)local_34c);
            writeToFileValue((FilereaderLp *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                             (double)in_stack_fffffffffffffac0,
                             SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
            writeToFile(in_RDI,(FILE *)local_b0," <=");
          }
          if ((local_a5 & 1) == 0) {
            writeToFileVar((FilereaderLp *)in_stack_fffffffffffffac0,
                           (FILE *)in_stack_fffffffffffffab8,0);
          }
          else {
            in_stack_fffffffffffffad8 = local_b0;
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&(local_28->lp_).col_names_,(long)local_34c);
            std::__cxx11::string::string(local_3b0,(string *)pvVar6);
            writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,
                           (FILE *)in_stack_fffffffffffffad8,(string *)in_stack_fffffffffffffad0);
            std::__cxx11::string::~string(local_3b0);
          }
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(local_28->lp_).col_upper_,(long)local_34c);
          if (*pvVar5 <= INFINITY && *pvVar5 != INFINITY) {
            writeToFile(in_RDI,(FILE *)local_b0," <=");
            in_stack_fffffffffffffad0 = local_b0;
            std::vector<double,_std::allocator<double>_>::operator[]
                      (&(local_28->lp_).col_upper_,(long)local_34c);
            writeToFileValue((FilereaderLp *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                             (double)in_stack_fffffffffffffac0,
                             SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
          }
        }
        else {
          if ((local_a5 & 1) == 0) {
            writeToFileVar((FilereaderLp *)in_stack_fffffffffffffac0,
                           (FILE *)in_stack_fffffffffffffab8,0);
          }
          else {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&(local_28->lp_).col_names_,(long)local_34c);
            std::__cxx11::string::string(local_390,(string *)pvVar6);
            writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,
                           (FILE *)in_stack_fffffffffffffad8,(string *)in_stack_fffffffffffffad0);
            std::__cxx11::string::~string(local_390);
          }
          writeToFile(in_RDI,(FILE *)local_b0," =");
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&(local_28->lp_).col_upper_,(long)local_34c);
          writeToFileValue((FilereaderLp *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                           (double)in_stack_fffffffffffffac0,
                           SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
        }
      }
      else {
        if ((local_a5 & 1) == 0) {
          writeToFileVar((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8
                         ,0);
        }
        else {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&(local_28->lp_).col_names_,(long)local_34c);
          std::__cxx11::string::string(local_370,(string *)pvVar6);
          writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,(FILE *)in_stack_fffffffffffffad8
                         ,(string *)in_stack_fffffffffffffad0);
          std::__cxx11::string::~string(local_370);
        }
        writeToFile(in_RDI,(FILE *)local_b0," free");
      }
      writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8
                        );
    }
  }
  sVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                    (&(local_28->lp_).integrality_);
  if (sVar4 != 0) {
    writeToFile(in_RDI,(FILE *)local_b0,"bin");
    writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8);
    for (local_3b4 = 0; local_3b4 < (local_28->lp_).num_col_; local_3b4 = local_3b4 + 1) {
      pvVar8 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         (&(local_28->lp_).integrality_,(long)local_3b4);
      if (*pvVar8 == kInteger) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(local_28->lp_).col_lower_,(long)local_3b4);
        if ((*pvVar5 == 0.0) && (!NAN(*pvVar5))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(local_28->lp_).col_upper_,(long)local_3b4);
          if ((*pvVar5 == 1.0) && (!NAN(*pvVar5))) {
            if ((local_a5 & 1) == 0) {
              writeToFileVar((FilereaderLp *)in_stack_fffffffffffffac0,
                             (FILE *)in_stack_fffffffffffffab8,0);
            }
            else {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&(local_28->lp_).col_names_,(long)local_3b4);
              std::__cxx11::string::string(local_3d8,(string *)pvVar6);
              writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,
                             (FILE *)in_stack_fffffffffffffad8,(string *)in_stack_fffffffffffffad0);
              std::__cxx11::string::~string(local_3d8);
            }
            writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,
                               (FILE *)in_stack_fffffffffffffab8);
          }
        }
      }
    }
    writeToFile(in_RDI,(FILE *)local_b0,"gen");
    writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8);
    for (local_3dc = 0; local_3dc < (local_28->lp_).num_col_; local_3dc = local_3dc + 1) {
      pvVar8 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         (&(local_28->lp_).integrality_,(long)local_3dc);
      if (*pvVar8 == kInteger) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(local_28->lp_).col_lower_,(long)local_3dc);
        if ((*pvVar5 == 0.0) && (!NAN(*pvVar5))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(local_28->lp_).col_upper_,(long)local_3dc);
          if ((*pvVar5 == 1.0) && (!NAN(*pvVar5))) goto LAB_0044f54f;
        }
        if ((local_a5 & 1) == 0) {
          writeToFileVar((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8
                         ,0);
        }
        else {
          in_stack_fffffffffffffac0 = local_b0;
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&(local_28->lp_).col_names_,(long)local_3dc);
          std::__cxx11::string::string(local_400,(string *)pvVar6);
          writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,(FILE *)in_stack_fffffffffffffad8
                         ,(string *)in_stack_fffffffffffffad0);
          std::__cxx11::string::~string(local_400);
        }
        writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,
                           (FILE *)in_stack_fffffffffffffab8);
      }
LAB_0044f54f:
    }
    writeToFile(in_RDI,(FILE *)local_b0,"semi");
    writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8);
    for (local_404 = 0; local_404 < (local_28->lp_).num_col_; local_404 = local_404 + 1) {
      pvVar8 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         (&(local_28->lp_).integrality_,(long)local_404);
      if ((*pvVar8 == kSemiContinuous) ||
         (pvVar8 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                             (&(local_28->lp_).integrality_,(long)local_404),
         *pvVar8 == kSemiInteger)) {
        if ((local_a5 & 1) == 0) {
          writeToFileVar((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8
                         ,0);
        }
        else {
          in_stack_fffffffffffffab8 = local_b0;
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&(local_28->lp_).col_names_,(long)local_404);
          std::__cxx11::string::string(local_428,(string *)pvVar6);
          writeToFileVar((FilereaderLp *)in_stack_fffffffffffffae0,(FILE *)in_stack_fffffffffffffad8
                         ,(string *)in_stack_fffffffffffffad0);
          std::__cxx11::string::~string(local_428);
        }
        writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,
                           (FILE *)in_stack_fffffffffffffab8);
      }
    }
  }
  writeToFile(in_RDI,(FILE *)local_b0,"end");
  writeToFileLineend((FilereaderLp *)in_stack_fffffffffffffac0,(FILE *)in_stack_fffffffffffffab8);
  fclose(local_b0);
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffac0);
  return kOk;
}

Assistant:

HighsStatus FilereaderLp::writeModelToFile(const HighsOptions& options,
                                           const std::string filename,
                                           const HighsModel& model) {
  const HighsLp& lp = model.lp_;
  // Create a row-wise copy of the matrix
  HighsSparseMatrix ar_matrix = lp.a_matrix_;
  ar_matrix.ensureRowwise();

  const bool has_col_names =
      allow_model_names &&
      lp.col_names_.size() == static_cast<size_t>(lp.num_col_);
  const bool has_row_names =
      allow_model_names &&
      lp.row_names_.size() == static_cast<size_t>(lp.num_row_);
  FILE* file = fopen(filename.c_str(), "w");

  // write comment at the start of the file
  this->writeToFile(file, "\\ %s", LP_COMMENT_FILESTART);
  this->writeToFileLineend(file);

  // write objective
  this->writeToFile(file, "%s",
                    lp.sense_ == ObjSense::kMinimize ? "min" : "max");
  this->writeToFileLineend(file);
  this->writeToFile(file, " obj:");
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double coef = lp.col_cost_[iCol];
    if (coef != 0.0) {
      this->writeToFileValue(file, coef);
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
    }
  }
  this->writeToFile(file,
                    " ");  // ToDo Unnecessary, but only to give empty diff
  if (model.isQp()) {
    this->writeToFile(file, "+ [");
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      for (HighsInt iEl = model.hessian_.start_[iCol];
           iEl < model.hessian_.start_[iCol + 1]; iEl++) {
        HighsInt iRow = model.hessian_.index_[iEl];
        if (iCol <= iRow) {
          double coef = model.hessian_.value_[iEl];
          if (iCol != iRow) coef *= 2;
          if (coef != 0.0) {
            this->writeToFileValue(file, coef);
            if (has_col_names) {
              this->writeToFileVar(file, lp.col_names_[iCol]);
              this->writeToFile(file, " *");
              this->writeToFileVar(file, lp.col_names_[iRow]);
            } else {
              this->writeToFileVar(file, iCol);
              this->writeToFile(file, " *");
              this->writeToFileVar(file, iRow);
            }
          }
        }
      }
    }
    this->writeToFile(file,
                      "  ]/2 ");  // ToDo Surely needs only to be one space
  }
  double coef = lp.offset_;
  if (coef != 0) this->writeToFileValue(file, coef);
  this->writeToFileLineend(file);

  // write constraint section, lower & upper bounds are one constraint
  // each
  this->writeToFile(file, "st");
  this->writeToFileLineend(file);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (lp.row_lower_[iRow] == lp.row_upper_[iRow]) {
      // Equality constraint
      if (has_row_names) {
        this->writeToFileVar(file, lp.row_names_[iRow]);
      } else {
        this->writeToFileCon(file, iRow);
      }
      this->writeToFile(file, ":");
      this->writeToFileMatrixRow(file, iRow, ar_matrix, lp.col_names_);
      this->writeToFile(file, " =");
      this->writeToFileValue(file, lp.row_lower_[iRow], true);
      this->writeToFileLineend(file);
    } else {
      // Need to distinguish the names when writing out boxed
      // constraint row as two single-sided constraints
      const bool boxed =
          lp.row_lower_[iRow] > -kHighsInf && lp.row_upper_[iRow] < kHighsInf;
      if (lp.row_lower_[iRow] > -kHighsInf) {
        // Has a lower bound
        if (has_row_names) {
          this->writeToFileVar(file, lp.row_names_[iRow]);
        } else {
          this->writeToFileCon(file, iRow);
        }
        if (boxed) {
          this->writeToFile(file, "lo:");
        } else {
          this->writeToFile(file, ":");
        }
        this->writeToFileMatrixRow(file, iRow, ar_matrix, lp.col_names_);
        this->writeToFile(file, " >=");
        this->writeToFileValue(file, lp.row_lower_[iRow], true);
        this->writeToFileLineend(file);
      }
      if (lp.row_upper_[iRow] < kHighsInf) {
        // Has an upper bound
        if (has_row_names) {
          this->writeToFileVar(file, lp.row_names_[iRow]);
        } else {
          this->writeToFileCon(file, iRow);
        }
        if (boxed) {
          this->writeToFile(file, "up:");
        } else {
          this->writeToFile(file, ":");
        }
        this->writeToFileMatrixRow(file, iRow, ar_matrix, lp.col_names_);
        this->writeToFile(file, " <=");
        this->writeToFileValue(file, lp.row_upper_[iRow], true);
        this->writeToFileLineend(file);
      }
    }
  }

  // write bounds section
  this->writeToFile(file, "bounds");
  this->writeToFileLineend(file);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    const bool default_bounds =
        lp.col_lower_[iCol] == 0 && lp.col_upper_[iCol] == kHighsInf;
    if (default_bounds) continue;
    if (lp.col_lower_[iCol] <= -kHighsInf && lp.col_upper_[iCol] >= kHighsInf) {
      // Free variable
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
      this->writeToFile(file, " free");
    } else if (lp.col_lower_[iCol] == lp.col_upper_[iCol]) {
      // Fixed variable
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
      this->writeToFile(file, " =");
      this->writeToFileValue(file, lp.col_upper_[iCol], false);
    } else {
      assert(!default_bounds);
      // Non-default bound
      if (lp.col_lower_[iCol] != 0) {
        // Nonzero lower bound
        this->writeToFileValue(file, lp.col_lower_[iCol], false);
        this->writeToFile(file, " <=");
      }
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
      if (lp.col_upper_[iCol] < kHighsInf) {
        // Finite upper bound
        this->writeToFile(file, " <=");
        this->writeToFileValue(file, lp.col_upper_[iCol], false);
      }
    }
    this->writeToFileLineend(file);
  }
  if (lp.integrality_.size() > 0) {
    // write binary section
    this->writeToFile(file, "bin");
    this->writeToFileLineend(file);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.integrality_[iCol] == HighsVarType::kInteger) {
        if (lp.col_lower_[iCol] == 0.0 && lp.col_upper_[iCol] == 1.0) {
          if (has_col_names) {
            this->writeToFileVar(file, lp.col_names_[iCol]);
          } else {
            this->writeToFileVar(file, iCol);
          }
          this->writeToFileLineend(file);
        }
      }
    }

    // write general section
    this->writeToFile(file, "gen");
    this->writeToFileLineend(file);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.integrality_[iCol] == HighsVarType::kInteger) {
        if (lp.col_lower_[iCol] != 0.0 || lp.col_upper_[iCol] != 1.0) {
          if (has_col_names) {
            this->writeToFileVar(file, lp.col_names_[iCol]);
          } else {
            this->writeToFileVar(file, iCol);
          }
          this->writeToFileLineend(file);
        }
      }
    }

    // write semi section
    this->writeToFile(file, "semi");
    this->writeToFileLineend(file);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
          lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
        if (has_col_names) {
          this->writeToFileVar(file, lp.col_names_[iCol]);
        } else {
          this->writeToFileVar(file, iCol);
        }
        this->writeToFileLineend(file);
      }
    }
  }
  // write end
  this->writeToFile(file, "end");
  this->writeToFileLineend(file);

  fclose(file);
  return HighsStatus::kOk;
}